

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObserver.cpp
# Opt level: O1

void __thiscall CEObserver::CEObserver(CEObserver *this,CEObserver *other)

{
  this->_vptr_CEObserver = (_func_int **)&PTR__CEObserver_00144b10;
  std::vector<double,_std::allocator<double>_>::vector(&this->pos_cirs_);
  std::vector<double,_std::allocator<double>_>::vector(&this->pos_icrs_);
  std::vector<double,_std::allocator<double>_>::vector(&this->vel_cirs_);
  std::vector<double,_std::allocator<double>_>::vector(&this->vel_icrs_);
  init_members(this);
  copy_members(this,other);
  return;
}

Assistant:

CEObserver::CEObserver(const CEObserver& other)
{
    init_members();
    copy_members(other);
}